

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

uint32 vorbis_find_page(stb_vorbis *f,uint32 *end,uint32 *last)

{
  uint uVar1;
  uint uVar2;
  byte bVar3;
  uint8 uVar4;
  uint uVar5;
  uint uVar6;
  undefined4 *in_RDX;
  uint *in_RSI;
  long in_RDI;
  int s;
  uint32 len;
  uint32 goal;
  uint32 crc;
  uint32 i_1;
  uint8 header [27];
  int i;
  uint retry_loc;
  int n;
  vorb *in_stack_ffffffffffffff98;
  uint local_58;
  uint32 local_50;
  uint local_4c;
  uint8 auStack_48 [5];
  byte local_43;
  byte local_32;
  byte local_31;
  byte local_30;
  byte local_2f;
  byte local_2e;
  int local_2c;
  uint local_28;
  uint local_24;
  undefined4 *local_20;
  uint *local_18;
  long local_10;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  do {
    do {
      if (*(int *)(local_10 + 0x98) != 0) {
        return 0;
      }
      bVar3 = get8(in_stack_ffffffffffffff98);
      local_24 = (uint)bVar3;
    } while (local_24 != 0x4f);
    local_28 = stb_vorbis_get_file_offset(in_stack_ffffffffffffff98);
    if (*(uint *)(local_10 + 0x58) < local_28 - 0x19) {
      return 0;
    }
    local_2c = 1;
    while ((local_2c < 4 &&
           (uVar4 = get8(in_stack_ffffffffffffff98), uVar4 == ogg_page_header[local_2c]))) {
      local_2c = local_2c + 1;
    }
    if (*(int *)(local_10 + 0x98) != 0) {
      return 0;
    }
    if (local_2c == 4) {
      for (local_4c = 0; local_4c < 4; local_4c = local_4c + 1) {
        auStack_48[local_4c] = ogg_page_header[local_4c];
      }
      for (; local_4c < 0x1b; local_4c = local_4c + 1) {
        uVar4 = get8(in_stack_ffffffffffffff98);
        auStack_48[local_4c] = uVar4;
      }
      if (*(int *)(local_10 + 0x98) != 0) {
        return 0;
      }
      if (auStack_48[4] == '\0') {
        uVar6 = (uint)local_31;
        uVar5 = (uint)local_32;
        uVar1 = (uint)local_30;
        uVar2 = (uint)local_2f;
        for (local_4c = 0x16; local_4c < 0x1a; local_4c = local_4c + 1) {
          auStack_48[local_4c] = '\0';
        }
        local_50 = 0;
        for (local_4c = 0; local_4c < 0x1b; local_4c = local_4c + 1) {
          local_50 = crc32_update(local_50,auStack_48[local_4c]);
        }
        local_58 = 0;
        for (local_4c = 0; local_4c < local_2e; local_4c = local_4c + 1) {
          bVar3 = get8(in_stack_ffffffffffffff98);
          local_50 = crc32_update(local_50,bVar3);
          local_58 = bVar3 + local_58;
        }
        if ((local_58 != 0) && (*(int *)(local_10 + 0x98) != 0)) {
          return 0;
        }
        for (local_4c = 0; local_4c < local_58; local_4c = local_4c + 1) {
          uVar4 = get8(in_stack_ffffffffffffff98);
          local_50 = crc32_update(local_50,uVar4);
        }
        if (local_50 == uVar5 + uVar6 * 0x100 + uVar1 * 0x10000 + uVar2 * 0x1000000) {
          if (local_18 != (uint *)0x0) {
            uVar6 = stb_vorbis_get_file_offset(in_stack_ffffffffffffff98);
            *local_18 = uVar6;
          }
          if (local_20 != (undefined4 *)0x0) {
            if ((local_43 & 4) == 0) {
              *local_20 = 0;
            }
            else {
              *local_20 = 1;
            }
          }
          set_file_offset(in_stack_ffffffffffffff98,0);
          return 1;
        }
      }
    }
    set_file_offset(in_stack_ffffffffffffff98,0);
  } while( true );
}

Assistant:

static uint32 vorbis_find_page(stb_vorbis *f, uint32 *end, uint32 *last)
{
   for(;;) {
      int n;
      if (f->eof) return 0;
      n = get8(f);
      if (n == 0x4f) { // page header candidate
         unsigned int retry_loc = stb_vorbis_get_file_offset(f);
         int i;
         // check if we're off the end of a file_section stream
         if (retry_loc - 25 > f->stream_len)
            return 0;
         // check the rest of the header
         for (i=1; i < 4; ++i)
            if (get8(f) != ogg_page_header[i])
               break;
         if (f->eof) return 0;
         if (i == 4) {
            uint8 header[27];
            uint32 i, crc, goal, len;
            for (i=0; i < 4; ++i)
               header[i] = ogg_page_header[i];
            for (; i < 27; ++i)
               header[i] = get8(f);
            if (f->eof) return 0;
            if (header[4] != 0) goto invalid;
            goal = header[22] + (header[23] << 8) + (header[24]<<16) + ((uint32)header[25]<<24);
            for (i=22; i < 26; ++i)
               header[i] = 0;
            crc = 0;
            for (i=0; i < 27; ++i)
               crc = crc32_update(crc, header[i]);
            len = 0;
            for (i=0; i < header[26]; ++i) {
               int s = get8(f);
               crc = crc32_update(crc, s);
               len += s;
            }
            if (len && f->eof) return 0;
            for (i=0; i < len; ++i)
               crc = crc32_update(crc, get8(f));
            // finished parsing probable page
            if (crc == goal) {
               // we could now check that it's either got the last
               // page flag set, OR it's followed by the capture
               // pattern, but I guess TECHNICALLY you could have
               // a file with garbage between each ogg page and recover
               // from it automatically? So even though that paranoia
               // might decrease the chance of an invalid decode by
               // another 2^32, not worth it since it would hose those
               // invalid-but-useful files?
               if (end)
                  *end = stb_vorbis_get_file_offset(f);
               if (last) {
                  if (header[5] & 0x04)
                     *last = 1;
                  else
                     *last = 0;
               }
               set_file_offset(f, retry_loc-1);
               return 1;
            }
         }
        invalid:
         // not a valid page, so rewind and look for next one
         set_file_offset(f, retry_loc);
      }
   }
}